

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderIntermediate.h
# Opt level: O0

void __thiscall
Assimp::Blender::TempArray<std::vector,_aiTexture>::~TempArray
          (TempArray<std::vector,_aiTexture> *this)

{
  aiTexture *this_00;
  bool bVar1;
  reference ppaVar2;
  aiTexture *elem;
  iterator __end0;
  iterator __begin0;
  mywrap *__range3;
  TempArray<std::vector,_aiTexture> *this_local;
  
  __end0 = ::std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::begin(&this->arr);
  elem = (aiTexture *)::std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::end(&this->arr);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<aiTexture_**,_std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>_>
                                *)&elem);
    if (!bVar1) break;
    ppaVar2 = __gnu_cxx::
              __normal_iterator<aiTexture_**,_std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>_>
              ::operator*(&__end0);
    this_00 = *ppaVar2;
    if (this_00 != (aiTexture *)0x0) {
      aiTexture::~aiTexture(this_00);
      operator_delete(this_00);
    }
    __gnu_cxx::
    __normal_iterator<aiTexture_**,_std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>_>::
    operator++(&__end0);
  }
  ::std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::~vector(&this->arr);
  return;
}

Assistant:

~TempArray () {
            for(T* elem : arr) {
                delete elem;
            }
        }